

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O1

int ncnn::gru_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                  float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                  float *weight_hc_int8_scales,Mat *hidden_state,Option *opt)

{
  uint _w;
  uint _h;
  size_t sVar1;
  void *pvVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined8 uVar27;
  int *piVar34;
  ulong uVar35;
  void *pvVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  float *pfVar43;
  ulong uVar44;
  long lVar45;
  int iVar46;
  ulong uVar47;
  ulong uVar48;
  void *pvVar49;
  void *pvVar50;
  void *pvVar51;
  void *pvVar52;
  void *pvVar53;
  uint uVar54;
  void *pvVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  Option opt_quant;
  float *bias_c_U;
  float *bias_c_R;
  Option opt_quant_1;
  ulong local_2d8;
  Mat local_298;
  Mat local_248;
  Mat local_1f8;
  Mat local_1a8;
  undefined1 local_158 [16];
  Mat local_148;
  Mat *local_f8;
  Mat *local_f0;
  Mat *local_e8;
  ulong local_e0;
  ulong local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  long local_b8;
  long local_b0;
  void *local_a8;
  void *local_a0;
  long local_98;
  long local_90;
  void *local_88;
  void *local_80;
  Option local_78;
  undefined4 uVar5;
  undefined3 uVar7;
  undefined2 uVar9;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined1 uVar31;
  undefined2 uVar32;
  undefined1 uVar33;
  
  _w = bottom_blob->w;
  uVar35 = (ulong)_w;
  _h = bottom_blob->h;
  uVar54 = top_blob->w;
  uVar41 = (ulong)uVar54;
  local_298.cstep = 0;
  local_298.data = (void *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize._0_4_ = 0;
  local_298.elemsize._4_4_ = 0;
  local_298.elempack = 0;
  local_298.allocator = (Allocator *)0x0;
  local_298.dims = 0;
  local_298.w = 0;
  local_298.h = 0;
  local_298.d = 0;
  local_298.c = 0;
  local_f8 = top_blob;
  local_f0 = weight_xc_int8;
  local_e8 = bias_c;
  Mat::create(&local_298,2,uVar54,4,opt->workspace_allocator);
  iVar39 = -100;
  if ((local_298.data != (void *)0x0) && ((long)local_298.c * local_298.cstep != 0)) {
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize._0_4_ = 0;
    local_1a8.elemsize._4_4_ = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    Mat::create(&local_1a8,_w,_h,1,1,opt->workspace_allocator);
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148._20_8_ = 0;
    local_148.allocator = (Allocator *)0x0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    Mat::create(&local_148,_h,4,1,opt->workspace_allocator);
    if (0 < (int)_h) {
      pvVar36 = bottom_blob->data;
      iVar39 = bottom_blob->w;
      sVar1 = bottom_blob->elemsize;
      uVar47 = 0;
      do {
        fVar58 = 0.0;
        if (0 < (int)_w) {
          uVar48 = 0;
          do {
            fVar60 = ABS(*(float *)((long)pvVar36 + uVar48 * 4));
            if (fVar58 <= fVar60) {
              fVar58 = fVar60;
            }
            uVar48 = uVar48 + 1;
          } while (uVar35 != uVar48);
        }
        *(float *)((long)local_148.data + uVar47 * 4) = 127.0 / fVar58;
        uVar47 = uVar47 + 1;
        pvVar36 = (void *)((long)pvVar36 + (long)iVar39 * sVar1);
      } while (uVar47 != _h);
    }
    local_248.data = *(void **)opt;
    uVar3 = opt->openmp_blocktime;
    uVar4 = opt->use_winograd_convolution;
    uVar6 = opt->use_sgemm_convolution;
    uVar8 = opt->use_int8_inference;
    uVar10 = opt->use_vulkan_compute;
    uVar9 = CONCAT11(uVar10,uVar8);
    uVar7 = CONCAT21(uVar9,uVar6);
    uVar5 = CONCAT31(uVar7,uVar4);
    uVar47._0_1_ = opt->use_bf16_storage;
    uVar47._1_1_ = opt->use_fp16_packed;
    uVar47._2_1_ = opt->use_fp16_storage;
    uVar47._3_1_ = opt->use_fp16_arithmetic;
    uVar47._4_1_ = opt->use_int8_packed;
    uVar47._5_1_ = opt->use_int8_storage;
    uVar47._6_1_ = opt->use_int8_arithmetic;
    uVar47._7_1_ = opt->use_packing_layout;
    uVar11 = opt->vulkan_device_index;
    uVar12 = opt->use_reserved_1;
    uVar14 = opt->use_image_storage;
    uVar16 = opt->use_tensor_storage;
    uVar18 = opt->use_reserved_2;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar13 = CONCAT31(uVar15,uVar12);
    uVar19 = opt->flush_denormals;
    uVar20 = opt->use_local_pool_allocator;
    uVar22 = opt->use_shader_local_memory;
    uVar24 = opt->use_cooperative_matrix;
    uVar26 = opt->use_winograd23_convolution;
    uVar25 = CONCAT11(uVar26,uVar24);
    uVar23 = CONCAT21(uVar25,uVar22);
    uVar21 = CONCAT31(uVar23,uVar20);
    uVar27._0_1_ = opt->use_winograd43_convolution;
    uVar27._1_1_ = opt->use_winograd63_convolution;
    uVar27._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar27._3_1_ = opt->use_fp16_uniform;
    uVar28 = opt->use_int8_uniform;
    uVar29 = opt->use_reserved_9;
    uVar31 = opt->use_reserved_10;
    uVar33 = opt->use_reserved_11;
    uVar32 = CONCAT11(uVar33,uVar31);
    uVar30 = CONCAT21(uVar32,uVar29);
    uVar27._4_4_ = CONCAT31(uVar30,uVar28);
    local_248.c = (int)uVar27;
    local_248.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_248.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_248.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_248.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_248.allocator = (Allocator *)(uVar47 & 0xffffffffffffff);
    local_248.elempack = uVar3;
    local_248._28_4_ = uVar5;
    local_248.dims = uVar11;
    local_248.w = uVar13;
    local_248.h = uVar19;
    local_248.d = uVar21;
    local_248._60_4_ = uVar27._4_4_;
    quantize_to_int8(bottom_blob,&local_1a8,&local_148,(Option *)&local_248);
    local_248.cstep = 0;
    local_248.data = (void *)0x0;
    local_248.refcount._0_4_ = 0;
    local_248.refcount._4_4_ = 0;
    local_248.elemsize._0_4_ = 0;
    local_248.elemsize._4_4_ = 0;
    local_248.elempack = 0;
    local_248.allocator = (Allocator *)0x0;
    local_248.dims = 0;
    local_248.w = 0;
    local_248.h = 0;
    local_248.d = 0;
    local_248.c = 0;
    Mat::create(&local_248,uVar54,1,1,opt->workspace_allocator);
    local_1f8.cstep = 0;
    local_1f8.data = (float *)0x0;
    local_1f8.refcount._0_4_ = 0;
    local_1f8.refcount._4_4_ = 0;
    local_1f8.elemsize._0_4_ = 0;
    local_1f8._20_8_ = 0;
    local_1f8.allocator = (Allocator *)0x0;
    local_1f8.dims = 0;
    local_1f8.w = 0;
    local_1f8.h = 0;
    local_1f8.d = 0;
    local_1f8.c = 0;
    Mat::create(&local_1f8,1,4,1,opt->workspace_allocator);
    if (0 < (int)_h) {
      uVar47 = (ulong)(uVar54 * 2);
      uVar48 = 0;
      local_d8 = uVar41;
      do {
        uVar44 = (ulong)(~(uint)uVar48 + _h);
        if (reverse == 0) {
          uVar44 = uVar48;
        }
        fVar58 = 0.0;
        if (0 < (int)uVar41) {
          uVar40 = 0;
          do {
            fVar60 = ABS(*(float *)((long)hidden_state->data + uVar40 * 4));
            if (fVar58 <= fVar60) {
              fVar58 = fVar60;
            }
            uVar40 = uVar40 + 1;
          } while (uVar41 != uVar40);
        }
        local_e0 = uVar48;
        if (fVar58 == 0.0) {
          *(float *)local_1f8.data = 1.0;
          if (0 < local_248.c * (int)local_248.cstep) {
            memset(local_248.data,0,(ulong)(uint)(local_248.c * (int)local_248.cstep));
          }
        }
        else {
          *(float *)local_1f8.data = 127.0 / fVar58;
          local_78.lightmode = opt->lightmode;
          local_78.use_shader_pack8 = opt->use_shader_pack8;
          local_78.use_subgroup_ops = opt->use_subgroup_ops;
          local_78.use_reserved_0 = opt->use_reserved_0;
          local_78.num_threads = opt->num_threads;
          local_78.workspace_allocator = opt->workspace_allocator;
          local_78.openmp_blocktime = opt->openmp_blocktime;
          local_78.use_winograd_convolution = opt->use_winograd_convolution;
          local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
          local_78.use_int8_inference = opt->use_int8_inference;
          local_78.use_vulkan_compute = opt->use_vulkan_compute;
          uVar48._0_1_ = opt->use_bf16_storage;
          uVar48._1_1_ = opt->use_fp16_packed;
          uVar48._2_1_ = opt->use_fp16_storage;
          uVar48._3_1_ = opt->use_fp16_arithmetic;
          uVar48._4_1_ = opt->use_int8_packed;
          uVar48._5_1_ = opt->use_int8_storage;
          uVar48._6_1_ = opt->use_int8_arithmetic;
          uVar48._7_1_ = opt->use_packing_layout;
          local_78.vulkan_device_index = opt->vulkan_device_index;
          local_78.use_reserved_1 = opt->use_reserved_1;
          local_78.use_image_storage = opt->use_image_storage;
          local_78.use_tensor_storage = opt->use_tensor_storage;
          local_78.use_reserved_2 = opt->use_reserved_2;
          local_78.flush_denormals = opt->flush_denormals;
          local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
          local_78.use_shader_local_memory = opt->use_shader_local_memory;
          local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
          local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
          local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
          local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
          local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
          local_78.use_fp16_uniform = opt->use_fp16_uniform;
          local_78.use_int8_uniform = opt->use_int8_uniform;
          local_78.use_reserved_9 = opt->use_reserved_9;
          local_78.use_reserved_10 = opt->use_reserved_10;
          local_78.use_reserved_11 = opt->use_reserved_11;
          local_78.blob_allocator = opt->workspace_allocator;
          local_78._32_8_ = uVar48 & 0xffffffffffffff;
          quantize_to_int8(hidden_state,&local_248,&local_1f8,&local_78);
        }
        pvVar2 = local_1a8.data;
        pvVar36 = local_248.data;
        lVar37 = (long)(int)uVar44;
        if (0 < (int)uVar41) {
          lVar45 = local_1a8.w * lVar37 *
                   CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
          fVar60 = 1.0 / *(float *)((long)local_148.data + lVar37 * 4);
          fVar58 = 1.0 / *local_1f8.data;
          local_98 = (long)local_298.w *
                     CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
          local_a0 = local_e8->data;
          lVar38 = (long)local_e8->w * local_e8->elemsize;
          local_a8 = (void *)((long)local_a0 + lVar38);
          pvVar49 = local_f0->data;
          pvVar53 = weight_hc_int8->data;
          local_c0 = (void *)((long)local_a0 + lVar38 * 2);
          local_c8 = (void *)(lVar38 * 3 + (long)local_a0);
          local_b0 = (long)local_f0->w * local_f0->elemsize;
          local_b8 = (long)weight_hc_int8->w * weight_hc_int8->elemsize;
          pvVar50 = (void *)(local_b0 * uVar41 + (long)pvVar49);
          pvVar55 = (void *)(local_b8 * uVar41 + (long)pvVar53);
          pvVar52 = (void *)(local_b8 * uVar47 + (long)pvVar53);
          pvVar51 = (void *)(local_b0 * uVar47 + (long)pvVar49);
          local_d0 = local_298.data;
          local_2d8 = 0;
          do {
            if ((int)_w < 1) {
              fVar56 = 0.0;
              fVar59 = 0.0;
            }
            else {
              uVar48 = 0;
              iVar39 = 0;
              iVar42 = 0;
              do {
                iVar46 = (int)*(char *)((long)pvVar2 + uVar48 + lVar45);
                iVar39 = iVar39 + *(char *)((long)pvVar49 + uVar48) * iVar46;
                iVar42 = iVar42 + *(char *)((long)pvVar50 + uVar48) * iVar46;
                uVar48 = uVar48 + 1;
              } while (uVar35 != uVar48);
              fVar59 = (float)iVar39;
              fVar56 = (float)iVar42;
            }
            local_90 = local_98 * local_2d8;
            uVar48 = 0;
            iVar42 = 0;
            iVar39 = 0;
            do {
              iVar46 = (int)*(char *)((long)pvVar36 + uVar48);
              iVar42 = iVar42 + *(char *)((long)pvVar53 + uVar48) * iVar46;
              iVar39 = iVar39 + *(char *)((long)pvVar55 + uVar48) * iVar46;
              uVar48 = uVar48 + 1;
            } while (uVar41 != uVar48);
            local_158 = ZEXT416((uint)(((float)iVar39 * fVar58) /
                                       weight_hc_int8_scales[local_2d8 + uVar41] +
                                       (fVar56 * fVar60) / weight_xc_int8_scales[local_2d8 + uVar41]
                                      + *(float *)((long)local_a8 + local_2d8 * 4)));
            local_88 = pvVar50;
            local_80 = pvVar49;
            fVar56 = expf(-(((float)iVar42 * fVar58) / weight_hc_int8_scales[local_2d8] +
                            (fVar59 * fVar60) / weight_xc_int8_scales[local_2d8] +
                           *(float *)((long)local_a0 + local_2d8 * 4)));
            fVar59 = expf(-(float)local_158._0_4_);
            uVar48 = 0;
            iVar39 = 0;
            do {
              iVar39 = iVar39 + (int)*(char *)((long)pvVar52 + uVar48) *
                                (int)*(char *)((long)pvVar36 + uVar48);
              uVar48 = uVar48 + 1;
            } while (uVar41 != uVar48);
            if ((int)_w < 1) {
              fVar57 = 0.0;
            }
            else {
              uVar41 = 0;
              iVar42 = 0;
              do {
                iVar42 = iVar42 + (int)*(char *)((long)pvVar51 + uVar41) *
                                  (int)*(char *)((long)pvVar2 + uVar41 + lVar45);
                uVar41 = uVar41 + 1;
              } while (uVar35 != uVar41);
              fVar57 = (float)iVar42;
            }
            local_158._0_4_ = 1.0 / (fVar59 + 1.0);
            fVar56 = tanhf((fVar57 * fVar60) / weight_xc_int8_scales[uVar47 + local_2d8] +
                           *(float *)((long)local_c0 + local_2d8 * 4) +
                           (((float)iVar39 * fVar58) / weight_hc_int8_scales[uVar47 + local_2d8] +
                           *(float *)((long)local_c8 + local_2d8 * 4)) / (fVar56 + 1.0));
            *(undefined4 *)((long)local_d0 + local_90) = local_158._0_4_;
            *(float *)((long)local_d0 + local_90 + 4) = fVar56;
            local_2d8 = local_2d8 + 1;
            pvVar50 = (void *)((long)local_88 + local_b0);
            pvVar49 = (void *)((long)local_80 + local_b0);
            pvVar55 = (void *)((long)pvVar55 + local_b8);
            pvVar53 = (void *)((long)pvVar53 + local_b8);
            pvVar52 = (void *)((long)pvVar52 + local_b8);
            pvVar51 = (void *)((long)pvVar51 + local_b0);
            uVar41 = local_d8;
          } while (local_2d8 != local_d8);
        }
        if (0 < (int)uVar41) {
          iVar39 = local_f8->w;
          sVar1 = local_f8->elemsize;
          pvVar36 = local_f8->data;
          pvVar2 = hidden_state->data;
          pfVar43 = (float *)((long)local_298.data + 4);
          uVar48 = 0;
          do {
            fVar58 = (*(float *)((long)pvVar2 + uVar48 * 4) - *pfVar43) * pfVar43[-1] + *pfVar43;
            *(float *)((long)pvVar2 + uVar48 * 4) = fVar58;
            *(float *)((long)pvVar36 + uVar48 * 4 + iVar39 * lVar37 * sVar1) = fVar58;
            uVar48 = uVar48 + 1;
            pfVar43 = (float *)((long)pfVar43 +
                               (long)local_298.w *
                               CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize));
          } while (uVar41 != uVar48);
        }
        uVar54 = (int)local_e0 + 1;
        uVar48 = (ulong)uVar54;
      } while (uVar54 != _h);
    }
    piVar34 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_1f8.allocator == (Allocator *)0x0) {
          if ((float *)local_1f8.data != (float *)0x0) {
            free(local_1f8.data);
          }
        }
        else {
          (*(local_1f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1f8.cstep = 0;
    local_1f8.data = (void *)0x0;
    local_1f8.refcount._0_4_ = 0;
    local_1f8.refcount._4_4_ = 0;
    local_1f8.elemsize._0_4_ = 0;
    local_1f8._20_8_ = 0;
    local_1f8.dims = 0;
    local_1f8.w = 0;
    local_1f8.h = 0;
    local_1f8.d = 0;
    local_1f8.c = 0;
    piVar34 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_248.allocator == (Allocator *)0x0) {
          if (local_248.data != (void *)0x0) {
            free(local_248.data);
          }
        }
        else {
          (*(local_248.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_248.cstep = 0;
    local_248.data = (void *)0x0;
    local_248.refcount._0_4_ = 0;
    local_248.refcount._4_4_ = 0;
    local_248.elemsize._0_4_ = 0;
    local_248.elemsize._4_4_ = 0;
    local_248.elempack = 0;
    local_248.dims = 0;
    local_248.w = 0;
    local_248.h = 0;
    local_248.d = 0;
    local_248.c = 0;
    piVar34 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if (local_148.data != (void *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148._20_8_ = 0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    piVar34 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize._0_4_ = 0;
    local_1a8.elemsize._4_4_ = 0;
    local_1a8.elempack = 0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    iVar39 = 0;
  }
  piVar34 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        if (local_298.data != (void *)0x0) {
          free(local_298.data);
        }
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

static int gru_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 2 x num_output
    Mat gates(2, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float* gates_data = gates.row(q);

            // gate reset update
            const float* bias_c_R = bias_c.row(0);
            const float* bias_c_U = bias_c.row(1);

            const signed char* weight_xc_int8_R = weight_xc_int8.row<const signed char>(num_output * 0 + q);
            const signed char* weight_xc_int8_U = weight_xc_int8.row<const signed char>(num_output * 1 + q);
            const signed char* weight_hc_int8_R = weight_hc_int8.row<const signed char>(num_output * 0 + q);
            const signed char* weight_hc_int8_U = weight_hc_int8.row<const signed char>(num_output * 1 + q);

            const float descale_xc_R = 1.f / weight_xc_int8_scales[num_output * 0 + q];
            const float descale_xc_U = 1.f / weight_xc_int8_scales[num_output * 1 + q];
            const float descale_hc_R = 1.f / weight_hc_int8_scales[num_output * 0 + q];
            const float descale_hc_U = 1.f / weight_hc_int8_scales[num_output * 1 + q];

            int Rx = 0;
            int Ux = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Rx += weight_xc_int8_R[i] * xi;
                Ux += weight_xc_int8_U[i] * xi;
            }

            int Rh = 0;
            int Uh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Rh += weight_hc_int8_R[i] * h_cont;
                Uh += weight_hc_int8_U[i] * h_cont;
            }

            float R = bias_c_R[q] + Rx * (descale_x * descale_xc_R) + Rh * (descale_h * descale_hc_R);
            float U = bias_c_U[q] + Ux * (descale_x * descale_xc_U) + Uh * (descale_h * descale_hc_U);

            // sigmoid(R)
            // sigmoid(U)
            R = 1.f / (1.f + expf(-R));
            U = 1.f / (1.f + expf(-U));

            // gate new
            const float* bias_c_WN = bias_c.row(2);
            const float* bias_c_BN = bias_c.row(3);

            const signed char* weight_xc_int8_N = weight_xc_int8.row<const signed char>(num_output * 2 + q);
            const signed char* weight_hc_int8_N = weight_hc_int8.row<const signed char>(num_output * 2 + q);

            const float descale_xc_N = 1.f / weight_xc_int8_scales[num_output * 2 + q];
            const float descale_hc_N = 1.f / weight_hc_int8_scales[num_output * 2 + q];

            int Nh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Nh += weight_hc_int8_N[i] * h_cont;
            }

            int Nx = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Nx += weight_xc_int8_N[i] * xi;
            }

            float N = bias_c_BN[q] + Nh * (descale_h * descale_hc_N);
            N = bias_c_WN[q] + R * N + Nx * (descale_x * descale_xc_N);

            // tanh(N)
            N = tanhf(N);

            gates_data[0] = U;
            gates_data[1] = N;
        }

        // h_t := (1 - update) .* new + update .* h_{t-1}
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float U = gates_data[0];
            float N = gates_data[1];

            float H = (1 - U) * N + U * hidden_state[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}